

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

SearchResult<int,_false> __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
::linear_search_impl<int,phmap::priv::upper_bound_adapter<std::greater<int>>>
          (btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
           *this,int *k,int s,int e)

{
  template_ElementType<2UL> *ptVar1;
  long lVar2;
  
  lVar2 = (long)s;
  if (s < e) {
    s = e;
  }
  while( true ) {
    if (e <= lVar2) {
      return (SearchResult<int,_false>)s;
    }
    ptVar1 = GetField<2ul>(this);
    if (ptVar1[lVar2].value.first < *k) break;
    lVar2 = lVar2 + 1;
  }
  return (SearchResult<int,_false>)(int)lVar2;
}

Assistant:

SearchResult<int, false> linear_search_impl(
            const K &k, int s, const int e, const Compare &comp,
            std::false_type /* IsCompareTo */) const {
            while (s < e) {
                if (!comp(key(s), k)) {
                    break;
                }
                ++s;
            }
            return {s};
        }